

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  bool bVar1;
  int32 value;
  FieldDescriptorProto_Label value_00;
  FieldDescriptorProto_Type value_01;
  LogMessage *other;
  string *psVar2;
  FieldOptions *this_00;
  FieldOptions *from_00;
  UnknownFieldSet *this_01;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FieldDescriptorProto *local_18;
  FieldDescriptorProto *from_local;
  FieldDescriptorProto *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0xb7a);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(local_18);
    if (bVar1) {
      psVar2 = name_abi_cxx11_(local_18);
      set_name(this,psVar2);
    }
    bVar1 = has_number(local_18);
    if (bVar1) {
      value = number(local_18);
      set_number(this,value);
    }
    bVar1 = has_label(local_18);
    if (bVar1) {
      value_00 = label(local_18);
      set_label(this,value_00);
    }
    bVar1 = has_type(local_18);
    if (bVar1) {
      value_01 = type(local_18);
      set_type(this,value_01);
    }
    bVar1 = has_type_name(local_18);
    if (bVar1) {
      psVar2 = type_name_abi_cxx11_(local_18);
      set_type_name(this,psVar2);
    }
    bVar1 = has_extendee(local_18);
    if (bVar1) {
      psVar2 = extendee_abi_cxx11_(local_18);
      set_extendee(this,psVar2);
    }
    bVar1 = has_default_value(local_18);
    if (bVar1) {
      psVar2 = default_value_abi_cxx11_(local_18);
      set_default_value(this,psVar2);
    }
    bVar1 = has_options(local_18);
    if (bVar1) {
      this_00 = mutable_options(this);
      from_00 = options(local_18);
      FieldOptions::MergeFrom(this_00,from_00);
    }
  }
  this_01 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_01,other_00);
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const FieldDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_number()) {
      set_number(from.number());
    }
    if (from.has_label()) {
      set_label(from.label());
    }
    if (from.has_type()) {
      set_type(from.type());
    }
    if (from.has_type_name()) {
      set_type_name(from.type_name());
    }
    if (from.has_extendee()) {
      set_extendee(from.extendee());
    }
    if (from.has_default_value()) {
      set_default_value(from.default_value());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FieldOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}